

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

longlong mkvparser::Segment::CreateInstance
                   (IMkvReader *pReader,longlong pos,Segment **pSegment,Type type)

{
  Type TVar1;
  int iVar2;
  longlong lVar3;
  long lVar4;
  longlong lVar5;
  long lVar6;
  ulong uVar7;
  Segment *pSVar8;
  ulong uVar9;
  longlong total;
  Type local_4c;
  long len;
  longlong available;
  ulong local_38;
  
  if (-1 < pos && pReader != (IMkvReader *)0x0) {
    *pSegment = (Segment *)0x0;
    iVar2 = (*pReader->_vptr_IMkvReader[1])(pReader,&total,&available);
    if (iVar2 < 0) {
      return (long)iVar2;
    }
    if ((ulong)available <= (ulong)total && -1 < available) {
      local_38 = 0xffffffffffffffff;
      local_4c = type;
      while( true ) {
        if ((-1 < total) && (total <= pos)) {
          return -2;
        }
        lVar3 = GetUIntLength(pReader,pos,&len);
        if (lVar3 != 0) {
          return lVar3;
        }
        lVar4 = len + pos;
        if ((-1 < total) && (total < lVar4)) {
          return -2;
        }
        if (available < lVar4) {
          return lVar4;
        }
        lVar3 = ReadID(pReader,pos,&len);
        if (lVar3 < 0) {
          return -2;
        }
        lVar4 = len + pos;
        lVar5 = GetUIntLength(pReader,lVar4,&len);
        if (lVar5 != 0) {
          return lVar5;
        }
        lVar6 = len + lVar4;
        if ((-1 < total) && (total < lVar6)) break;
        if (available < lVar6) {
          return lVar6;
        }
        uVar7 = ReadUInt(pReader,lVar4,&len);
        TVar1 = local_4c;
        if ((long)uVar7 < 0) {
          return uVar7;
        }
        lVar4 = lVar4 + len;
        uVar9 = -1L << ((char)len * '\a' & 0x3fU) ^ uVar7;
        if (lVar3 == 0x18538067) {
          if (((uVar9 != 0xffffffffffffffff) && (-1 < total)) &&
             (local_38 = 0xffffffffffffffff, (long)(uVar7 + lVar4) <= total)) {
            local_38 = uVar7;
          }
          pSVar8 = (Segment *)operator_new(0xd0,(nothrow_t *)&std::nothrow);
          if (pSVar8 != (Segment *)0x0) {
            pSVar8->m_pReader = pReader;
            pSVar8->m_element_start = pos;
            pSVar8->m_start = lVar4;
            pSVar8->m_size = local_38;
            (pSVar8->m_eos).m_pSegment = (Segment *)0x0;
            (pSVar8->m_eos).m_element_start = 0;
            (pSVar8->m_eos).m_index = 0;
            (pSVar8->m_eos).m_pos = 0;
            (pSVar8->m_eos).m_entries_count = 0;
            (pSVar8->m_eos).m_element_size = 0;
            (pSVar8->m_eos).m_timecode = 0;
            (pSVar8->m_eos).m_entries = (BlockEntry **)0x0;
            (pSVar8->m_eos).m_entries_size = 0;
            pSVar8->m_type = TVar1;
            pSVar8->m_pos = lVar4;
            pSVar8->m_pUnknownSize = (Cluster *)0x0;
            pSVar8->m_pSeekHead = (SeekHead *)0x0;
            pSVar8->m_pInfo = (SegmentInfo *)0x0;
            pSVar8->m_pTracks = (Tracks *)0x0;
            pSVar8->m_pCues = (Cues *)0x0;
            pSVar8->m_pChapters = (Chapters *)0x0;
            pSVar8->m_pTags = (Tags *)0x0;
            pSVar8->m_clusters = (Cluster **)0x0;
            pSVar8->m_clusterCount = 0;
            pSVar8->m_clusterPreloadCount = 0;
            pSVar8->m_clusterSize = 0;
          }
          *pSegment = pSVar8;
          return -(ulong)(pSVar8 == (Segment *)0x0);
        }
        if (uVar9 == 0xffffffffffffffff) {
          return -2;
        }
        pos = lVar4 + uVar7;
        if ((-1 < total) && (total < pos)) {
          return -2;
        }
        if (available < pos) {
          return pos;
        }
      }
      return -2;
    }
  }
  return -1;
}

Assistant:

long long Segment::CreateInstance(IMkvReader* pReader, long long pos,
                                  Segment*& pSegment, Type type) {
  if (pReader == NULL || pos < 0)
    return E_PARSE_FAILED;

  pSegment = NULL;

  long long total, available;

  const long status = pReader->Length(&total, &available);

  if (status < 0)  // error
    return status;

  if (available < 0)
    return -1;

  if ((total >= 0) && (available > total))
    return -1;

  // I would assume that in practice this loop would execute
  // exactly once, but we allow for other elements (e.g. Void)
  // to immediately follow the EBML header.  This is fine for
  // the source filter case (since the entire file is available),
  // but in the splitter case over a network we should probably
  // just give up early.  We could for example decide only to
  // execute this loop a maximum of, say, 10 times.
  // TODO:
  // There is an implied "give up early" by only parsing up
  // to the available limit.  We do do that, but only if the
  // total file size is unknown.  We could decide to always
  // use what's available as our limit (irrespective of whether
  // we happen to know the total file length).  This would have
  // as its sense "parse this much of the file before giving up",
  // which a slightly different sense from "try to parse up to
  // 10 EMBL elements before giving up".

  for (;;) {
    if ((total >= 0) && (pos >= total))
      return E_FILE_FORMAT_INVALID;

    // Read ID
    long len;
    long long result = GetUIntLength(pReader, pos, len);

    if (result)  // error, or too few available bytes
      return result;

    if ((total >= 0) && ((pos + len) > total))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > available)
      return pos + len;

    const long long idpos = pos;
    const long long id = ReadID(pReader, pos, len);

    if (id < 0)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume ID

    // Read Size

    result = GetUIntLength(pReader, pos, len);

    if (result)  // error, or too few available bytes
      return result;

    if ((total >= 0) && ((pos + len) > total))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > available)
      return pos + len;

    long long size = ReadUInt(pReader, pos, len);

    if (size < 0)  // error
      return size;

    pos += len;  // consume length of size of element

    // Pos now points to start of payload

    // Handle "unknown size" for live streaming of webm files.
    const long long unknown_size = (1LL << (7 * len)) - 1;

    if (id == libwebm::kMkvSegment) {
      if (size == unknown_size)
        size = -1;

      else if (total < 0)
        size = -1;

      else if ((pos + size) > total)
        size = -1;

      pSegment = new (std::nothrow) Segment(pReader, idpos, pos, size, type);
      if (pSegment == NULL)
        return E_PARSE_FAILED;

      return 0;  // success
    }

    if (size == unknown_size)
      return E_FILE_FORMAT_INVALID;

    if ((total >= 0) && ((pos + size) > total))
      return E_FILE_FORMAT_INVALID;

    if ((pos + size) > available)
      return pos + size;

    pos += size;  // consume payload
  }
}